

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCodeRunJustOnce(Parse *pParse,Expr *pExpr,int regDest)

{
  Vdbe *p;
  bool bVar1;
  int iVar2;
  int iVar3;
  Expr *pExpr_00;
  ExprList *pEVar4;
  long lVar5;
  Op *pOVar6;
  int unaff_R12D;
  int iVar7;
  anon_union_4_2_6146edf4_for_u *paVar8;
  
  pEVar4 = pParse->pConstExpr;
  if (pEVar4 != (ExprList *)0x0 && regDest < 0) {
    iVar3 = pEVar4->nExpr;
    bVar1 = iVar3 < 1;
    if (0 < iVar3) {
      paVar8 = &pEVar4->a[0].u;
      iVar3 = iVar3 + 1;
      do {
        if (((paVar8->iConstExprReg & 0x80000000000U) != 0) &&
           (iVar2 = sqlite3ExprCompare((Parse *)0x0,((ExprList_item *)(paVar8 + -5))->pExpr,pExpr,-1
                                      ), iVar2 == 0)) {
          unaff_R12D = paVar8->iConstExprReg;
          break;
        }
        iVar7 = iVar3 + -1;
        paVar8 = paVar8 + 6;
        iVar2 = iVar3 + -3;
        bVar1 = iVar7 < 2;
        iVar3 = iVar7;
      } while (SBORROW4(iVar7,2) == iVar2 < 0);
    }
    if (!bVar1) {
      return unaff_R12D;
    }
  }
  if (pExpr == (Expr *)0x0) {
    pExpr_00 = (Expr *)0x0;
  }
  else {
    pExpr_00 = exprDup(pParse->db,pExpr,0,(u8 **)0x0);
  }
  if ((pExpr_00 == (Expr *)0x0) || ((pExpr_00->flags & 8) == 0)) {
    pEVar4 = sqlite3ExprListAppend(pParse,pEVar4,pExpr_00);
    if (pEVar4 != (ExprList *)0x0) {
      lVar5 = (long)pEVar4->nExpr;
      *(ushort *)&pEVar4->a[lVar5 + -1].fg.field_0x1 =
           (*(ushort *)&pEVar4->a[lVar5 + -1].fg.field_0x1 & 0xfff7) + (short)(regDest >> 0x1f) * -8
      ;
      if (regDest < 0) {
        regDest = pParse->nMem + 1;
        pParse->nMem = regDest;
      }
      pEVar4->a[lVar5 + -1].u.iConstExprReg = regDest;
    }
    pParse->pConstExpr = pEVar4;
  }
  else {
    p = pParse->pVdbe;
    iVar3 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
    pParse->okConstFactor = '\0';
    if (pParse->db->mallocFailed == '\0') {
      if (regDest < 0) {
        regDest = pParse->nMem + 1;
        pParse->nMem = regDest;
      }
      sqlite3ExprCode(pParse,pExpr_00,regDest);
    }
    pParse->okConstFactor = '\x01';
    sqlite3ExprDeleteNN(pParse->db,pExpr_00);
    if (p->db->mallocFailed == '\0') {
      pOVar6 = p->aOp + iVar3;
    }
    else {
      pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar6->p2 = p->nOp;
  }
  return regDest;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeRunJustOnce(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->fg.reusable
       && sqlite3ExprCompare(0,pItem->pExpr,pExpr,-1)==0
      ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  if( pExpr!=0 && ExprHasProperty(pExpr, EP_HasFunc) ){
    Vdbe *v = pParse->pVdbe;
    int addr;
    assert( v );
    addr = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
    pParse->okConstFactor = 0;
    if( !pParse->db->mallocFailed ){
      if( regDest<0 ) regDest = ++pParse->nMem;
      sqlite3ExprCode(pParse, pExpr, regDest);
    }
    pParse->okConstFactor = 1;
    sqlite3ExprDelete(pParse->db, pExpr);
    sqlite3VdbeJumpHere(v, addr);
  }else{
    p = sqlite3ExprListAppend(pParse, p, pExpr);
    if( p ){
       struct ExprList_item *pItem = &p->a[p->nExpr-1];
       pItem->fg.reusable = regDest<0;
       if( regDest<0 ) regDest = ++pParse->nMem;
       pItem->u.iConstExprReg = regDest;
    }
    pParse->pConstExpr = p;
  }
  return regDest;
}